

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wcssub.c
# Opt level: O3

int fits_read_wcstab(fitsfile *fptr,int nwtb,wtbarr *wtb,int *status)

{
  int *piVar1;
  size_t sVar2;
  int iVar3;
  double ***pppdVar4;
  size_t *naxes;
  double *pdVar5;
  int iVar6;
  long lVar7;
  size_t __nmemb;
  wtbarr *pwVar8;
  size_t *local_58;
  int naxis;
  int hdunum;
  int colnum;
  int local_3c;
  int nostat;
  int anynul;
  
  if (*status != 0) {
    return *status;
  }
  if (fptr == (fitsfile *)0x0) {
    *status = 0x73;
    iVar6 = 0x73;
  }
  else if (nwtb == 0) {
    iVar6 = 0;
  }
  else {
    if (nwtb < 1) {
      ffghdn(fptr,&hdunum);
LAB_00200694:
      local_58 = (size_t *)0x0;
      naxes = local_58;
    }
    else {
      pppdVar4 = &wtb->arrayp;
      iVar6 = nwtb;
      do {
        **pppdVar4 = (double *)0x0;
        pppdVar4 = pppdVar4 + 0x19;
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
      ffghdn(fptr,&hdunum);
      local_58 = (size_t *)0x0;
      naxes = local_58;
      if (0 < nwtb) {
        iVar6 = 0;
        pwVar8 = wtb;
        do {
          iVar3 = ffmnhd(fptr,2,pwVar8->extnam,pwVar8->extver,status);
          naxes = local_58;
          if ((iVar3 != 0) || (iVar3 = ffgcno(fptr,0,pwVar8->ttype,&colnum,status), iVar3 != 0))
          break;
          iVar3 = pwVar8->ndim;
          local_3c = iVar6;
          if ((long)iVar3 < 1) {
            *status = 0x143;
            goto LAB_00200694;
          }
          naxes = (size_t *)calloc((long)iVar3,8);
          if (naxes == (size_t *)0x0) {
LAB_0020069e:
            *status = 0x71;
            local_58 = (size_t *)0x0;
            naxes = local_58;
            break;
          }
          iVar6 = ffgtdm(fptr,colnum,iVar3,&naxis,(long *)naxes,status);
          if (iVar6 != 0) break;
          if (naxis == pwVar8->ndim) {
            __nmemb = *naxes;
            if (pwVar8->kind == 99) {
              if (1 < naxis) goto LAB_002005b4;
            }
            else if (__nmemb != (long)*pwVar8->dimlen) goto LAB_002006b6;
          }
          else {
            if ((pwVar8->ndim != 2) || (pwVar8->kind != 99)) {
LAB_002006b6:
              *status = 0x107;
              break;
            }
            naxis = 2;
            naxes[1] = *naxes;
            *naxes = 1;
            __nmemb = 1;
LAB_002005b4:
            piVar1 = pwVar8->dimlen;
            lVar7 = 0;
            do {
              sVar2 = naxes[lVar7 + 1];
              piVar1[lVar7] = (int)sVar2;
              lVar7 = lVar7 + 1;
              __nmemb = __nmemb * sVar2;
            } while (lVar7 < (long)naxis + -1);
          }
          free(naxes);
          pdVar5 = (double *)calloc(__nmemb,8);
          *pwVar8->arrayp = pdVar5;
          if (pdVar5 == (double *)0x0) goto LAB_0020069e;
          iVar6 = ffgcvd(fptr,colnum,pwVar8->row,1,__nmemb,0.0,*pwVar8->arrayp,&anynul,status);
          naxes = local_58;
          if (iVar6 != 0) break;
          iVar6 = local_3c + 1;
          pwVar8 = pwVar8 + 1;
        } while (iVar6 < nwtb);
      }
    }
    local_58 = naxes;
    nostat = 0;
    ffmahd(fptr,hdunum,(int *)0x0,&nostat);
    if (local_58 != (size_t *)0x0) {
      free(local_58);
    }
    iVar6 = *status;
    if (iVar6 != 0 && 0 < nwtb) {
      pppdVar4 = &wtb->arrayp;
      do {
        if (**pppdVar4 != (double *)0x0) {
          free(**pppdVar4);
        }
        pppdVar4 = pppdVar4 + 0x19;
        nwtb = nwtb + -1;
      } while (nwtb != 0);
      iVar6 = *status;
    }
  }
  return iVar6;
}

Assistant:

int fits_read_wcstab(
   fitsfile   *fptr, /* I - FITS file pointer           */
   int  nwtb,        /* Number of arrays to be read from the binary table(s) */
   wtbarr *wtb,      /* Address of the first element of an array of wtbarr
                         typedefs.  This wtbarr typedef is defined below to
                         match the wtbarr struct defined in WCSLIB.  An array
                         of such structs returned by the WCSLIB function
                         wcstab(). */
   int  *status)

/*
*   Author: Mark Calabretta, Australia Telescope National Facility
*   http://www.atnf.csiro.au/~mcalabre/index.html
*
*   fits_read_wcstab() extracts arrays from a binary table required in
*   constructing -TAB coordinates.  This helper routine is intended for
*   use by routines in the WCSLIB library when dealing with the -TAB table
*   look up WCS convention.
*/

{
   int  anynul, colnum, hdunum, iwtb, m, naxis, nostat;
   long *naxes = 0, nelem;
   wtbarr *wtbp;


   if (*status) return *status;

   if (fptr == 0) {
      return (*status = NULL_INPUT_PTR);
   }

   if (nwtb == 0) return 0;

   /* Zero the array pointers. */
   wtbp = wtb;
   for (iwtb = 0; iwtb < nwtb; iwtb++, wtbp++) {
     *wtbp->arrayp = 0x0;
   }

   /* Save HDU number so that we can move back to it later. */
   fits_get_hdu_num(fptr, &hdunum);

   wtbp = wtb;
   for (iwtb = 0; iwtb < nwtb; iwtb++, wtbp++) {
      /* Move to the required binary table extension. */
      if (fits_movnam_hdu(fptr, BINARY_TBL, (char *)(wtbp->extnam),
          wtbp->extver, status)) {
         goto cleanup;
      }

      /* Locate the table column. */
      if (fits_get_colnum(fptr, CASEINSEN, (char *)(wtbp->ttype), &colnum,
          status)) {
         goto cleanup;
      }

      /* Get the array dimensions and check for consistency. */
      if (wtbp->ndim < 1) {
         *status = NEG_AXIS;
         goto cleanup;
      }

      if (!(naxes = calloc(wtbp->ndim, sizeof(long)))) {
         *status = MEMORY_ALLOCATION;
         goto cleanup;
      }

      if (fits_read_tdim(fptr, colnum, wtbp->ndim, &naxis, naxes, status)) {
         goto cleanup;
      }

      if (naxis != wtbp->ndim) {
         if (wtbp->kind == 'c' && wtbp->ndim == 2) {
            /* Allow TDIMn to be omitted for degenerate coordinate arrays. */
            naxis = 2;
            naxes[1] = naxes[0];
            naxes[0] = 1;
         } else {
            *status = BAD_TDIM;
            goto cleanup;
         }
      }

      if (wtbp->kind == 'c') {
         /* Coordinate array; calculate the array size. */
         nelem = naxes[0];
         for (m = 0; m < naxis-1; m++) {
            *(wtbp->dimlen + m) = naxes[m+1];
            nelem *= naxes[m+1];
         }
      } else {
         /* Index vector; check length. */
         if ((nelem = naxes[0]) != *(wtbp->dimlen)) {
            /* N.B. coordinate array precedes the index vectors. */
            *status = BAD_TDIM;
            goto cleanup;
         }
      }

      free(naxes);
      naxes = 0;

      /* Allocate memory for the array. */
      if (!(*wtbp->arrayp = calloc((size_t)nelem, sizeof(double)))) {
         *status = MEMORY_ALLOCATION;
         goto cleanup;
      }

      /* Read the array from the table. */
      if (fits_read_col_dbl(fptr, colnum, wtbp->row, 1L, nelem, 0.0,
          *wtbp->arrayp, &anynul, status)) {
         goto cleanup;
      }
   }

cleanup:
   /* Move back to the starting HDU. */
   nostat = 0;
   fits_movabs_hdu(fptr, hdunum, 0, &nostat);

   /* Release allocated memory. */
   if (naxes) free(naxes);
   if (*status) {
      wtbp = wtb;
      for (iwtb = 0; iwtb < nwtb; iwtb++, wtbp++) {
         if (*wtbp->arrayp) free(*wtbp->arrayp);
      }
   }

   return *status;
}